

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t lzx_read_pre_tree(lzx_stream *strm)

{
  wchar_t *pwVar1;
  lzx_dec *plVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  long lVar5;
  
  plVar2 = strm->ds;
  wVar4 = plVar2->loop;
  lVar5 = (long)wVar4;
  if (lVar5 == 0) {
    (plVar2->pt).freq[0xc] = L'\0';
    (plVar2->pt).freq[0xd] = L'\0';
    (plVar2->pt).freq[0xe] = L'\0';
    (plVar2->pt).freq[0xf] = L'\0';
    (plVar2->pt).freq[8] = L'\0';
    (plVar2->pt).freq[9] = L'\0';
    (plVar2->pt).freq[10] = L'\0';
    (plVar2->pt).freq[0xb] = L'\0';
    (plVar2->pt).freq[4] = L'\0';
    (plVar2->pt).freq[5] = L'\0';
    (plVar2->pt).freq[6] = L'\0';
    (plVar2->pt).freq[7] = L'\0';
    (plVar2->pt).freq[0] = L'\0';
    (plVar2->pt).freq[1] = L'\0';
    (plVar2->pt).freq[2] = L'\0';
    (plVar2->pt).freq[3] = L'\0';
    (plVar2->pt).freq[0x10] = L'\0';
  }
  wVar3 = L'\x01';
  if (wVar4 < (plVar2->pt).len_size) {
    wVar4 = (plVar2->br).cache_avail;
    do {
      if (wVar4 < L'\x04') {
        wVar3 = lzx_br_fillup(strm,&plVar2->br);
        wVar4 = (plVar2->br).cache_avail;
        if (wVar4 < L'\x04' && wVar3 == L'\0') {
          wVar3 = L'\0';
          goto LAB_0014428f;
        }
      }
      (plVar2->pt).bitlen[lVar5] =
           (byte)((plVar2->br).cache_buffer >> ((char)wVar4 - 4U & 0x3f)) & 0xf;
      pwVar1 = (plVar2->pt).freq + (plVar2->pt).bitlen[lVar5];
      *pwVar1 = *pwVar1 + L'\x01';
      wVar4 = (plVar2->br).cache_avail + L'\xfffffffc';
      (plVar2->br).cache_avail = wVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (plVar2->pt).len_size);
    wVar3 = L'\x01';
  }
LAB_0014428f:
  plVar2->loop = (wchar_t)lVar5;
  return wVar3;
}

Assistant:

static int
lzx_read_pre_tree(struct lzx_stream *strm)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int i;

	if (ds->loop == 0)
		memset(ds->pt.freq, 0, sizeof(ds->pt.freq));
	for (i = ds->loop; i < ds->pt.len_size; i++) {
		if (!lzx_br_read_ahead(strm, br, 4)) {
			ds->loop = i;
			return (0);
		}
		ds->pt.bitlen[i] = lzx_br_bits(br, 4);
		ds->pt.freq[ds->pt.bitlen[i]]++;
		lzx_br_consume(br, 4);
	}
	ds->loop = i;
	return (1);
}